

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::Trim(EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint uVar1;
  int s;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  this_local = (EpsCopyOutputStream *)ptr;
  if ((this->had_error_ & 1U) == 0) {
    uVar1 = Flush(this,ptr);
    (*this->stream_->_vptr_ZeroCopyOutputStream[3])(this->stream_,(ulong)uVar1);
    this->end_ = this->buffer_;
    this->buffer_end_ = this->buffer_;
    this_local = (EpsCopyOutputStream *)this->buffer_;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* EpsCopyOutputStream::Trim(uint8_t* ptr) {
  if (had_error_) return ptr;
  int s = Flush(ptr);
  stream_->BackUp(s);
  // Reset to initial state (expecting new buffer)
  buffer_end_ = end_ = buffer_;
  return buffer_;
}